

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  fnet_socket_t sock;
  size_t read_len;
  fnet_address_t addr;
  char cli_addr [128];
  fnet_address_t srv_addr;
  char buf [65536];
  
  fnet_socket_init();
  fnet_str2addr("127.0.0.1:10500",&srv_addr);
  sock = fnet_socket_bind(FNET_SOCK_DGRAM,&srv_addr);
  read_len = 0;
  _Var1 = fnet_socket_recvfrom(sock,buf,0x10000,&read_len,&addr);
  if (_Var1) {
    buf[read_len - 1] = '\0';
    fnet_addr2str(&addr,cli_addr,0x80);
    printf("Got: %s, from %s\n",buf,cli_addr);
    fnet_socket_sendto(sock,buf,read_len,&addr);
  }
  fnet_socket_close(sock);
  fnet_socket_uninit();
  return 0;
}

Assistant:

int main()
{
    fnet_socket_init();

    fnet_address_t srv_addr;
    fnet_str2addr("127.0.0.1:10500", &srv_addr);
    fnet_socket_t srv = fnet_socket_bind(FNET_SOCK_DGRAM, &srv_addr);

    char buf[65536];
    size_t read_len = 0;
    fnet_address_t addr;
    
    if (fnet_socket_recvfrom(srv, buf, sizeof buf, &read_len, &addr))
    {
        buf[read_len - 1] = 0;
        
        char cli_addr[128];
        fnet_addr2str(&addr, cli_addr, sizeof cli_addr);
        printf("Got: %s, from %s\n", buf, cli_addr);

        fnet_socket_sendto(srv, buf, read_len, &addr);
    }

    fnet_socket_close(srv);
    fnet_socket_uninit();
    return 0;
}